

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_conjunctive.cpp
# Opt level: O1

BatchResult * __thiscall SelectJitOperator::next(SelectJitOperator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  int iVar5;
  undefined4 extraout_var;
  mapped_type *ppDVar6;
  DbVector<unsigned_int> *pDVar7;
  uint *puVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  key_type local_58;
  SelectJitOperator *local_38;
  BatchResult *this_00;
  
  iVar5 = (*this->next_->_vptr_BaseOperator[4])();
  this_00 = (BatchResult *)CONCAT44(extraout_var,iVar5);
  if (this_00 == (BatchResult *)0x0) {
    return (BatchResult *)0x0;
  }
  uVar9 = **(uint **)(*(_Base_ptr *)(&(this_00->data)._M_t._M_impl.field_0x0 + 0x18) + 2);
  uVar13 = (ulong)uVar9;
  paVar1 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"tax","");
  ppDVar6 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DbVector<int>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DbVector<int>_*>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DbVector<int>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DbVector<int>_*>_>_>
                          *)this_00,&local_58);
  piVar2 = (*ppDVar6)->col;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"discount","");
  ppDVar6 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DbVector<int>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DbVector<int>_*>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DbVector<int>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DbVector<int>_*>_>_>
                          *)this_00,&local_58);
  piVar3 = (*ppDVar6)->col;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"extprice","");
  local_38 = this;
  ppDVar6 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DbVector<int>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DbVector<int>_*>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DbVector<int>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DbVector<int>_*>_>_>
                          *)this_00,&local_58);
  piVar4 = (*ppDVar6)->col;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pDVar7 = (DbVector<unsigned_int> *)operator_new(0x10);
  pDVar7->n = uVar9;
  pDVar7->capacity = uVar9;
  puVar8 = (uint *)operator_new__(uVar13 * 4);
  pDVar7->col = puVar8;
  if (local_38->branching_ == false) {
    if (uVar9 != 0) {
      uVar10 = 0;
      uVar9 = 0;
      do {
        puVar8[uVar9] = (uint)uVar10;
        uVar11 = 0;
        if ((piVar2[uVar10] < 0x32) && (piVar3[uVar10] < 0x32)) {
          uVar11 = (uint)(piVar4[uVar10] < 0x32);
        }
        uVar9 = uVar9 + uVar11;
        uVar10 = uVar10 + 1;
      } while (uVar13 != uVar10);
      goto LAB_0010433f;
    }
  }
  else if (uVar9 != 0) {
    uVar10 = 0;
    uVar9 = 0;
    do {
      if (((piVar2[uVar10] < 0x32) && (piVar3[uVar10] < 0x32)) && (piVar4[uVar10] < 0x32)) {
        uVar12 = (ulong)uVar9;
        uVar9 = uVar9 + 1;
        puVar8[uVar12] = (uint)uVar10;
      }
      uVar10 = uVar10 + 1;
    } while (uVar13 != uVar10);
    goto LAB_0010433f;
  }
  uVar9 = 0;
LAB_0010433f:
  pDVar7->n = uVar9;
  this_00->res_sel = pDVar7;
  return this_00;
}

Assistant:

BatchResult* next() {
        BatchResult *br = next_->next();
        if (br == nullptr)
            return br;

        uint32_t n = br->getn();
        int32_t *tax = br->getCol("tax")->col;
        int32_t *discount = br->getCol("discount")->col;
        int32_t *extprice = br->getCol("extprice")->col;

        DbVector<uint32_t> *res_sel = new DbVector<uint32_t>(n);
        auto res_sel_col = res_sel->col;
        uint32_t res = 0;
        if (branching_) {
            for (uint32_t i = 0; i < n; i++) {
                if (tax[i] < 50 && discount[i] < 50 && extprice[i] < 50)
                    res_sel_col[res++] = i;
            }
        }
        else {
            for (uint32_t i = 0; i < n; i++) {
                res_sel_col[res] = i;
                res += (tax[i] < 50 && discount[i] < 50 && extprice[i] < 50);
            }
        }
        res_sel->n = res;
        br->res_sel = res_sel;

        // std::cout << "n=" << res_sel->n << ", capacity=" << res_sel->capacity << ", col=" << (uint64_t)res_sel->col << "\n";
        return br;
    }